

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NutDecompiler.cpp
# Opt level: O0

void __thiscall NutFunction::GenerateBodySource(NutFunction *this,int n,ostream *out)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  reference piVar6;
  void *this_00;
  reference obj;
  pointer pOVar7;
  size_type sVar8;
  pointer pLVar9;
  const_reference pvVar10;
  pointer pLVar11;
  LocalVariableExpression *this_01;
  ExpressionPtr *this_02;
  char *pcVar12;
  shared_ptr<Expression> local_160 [2];
  undefined1 local_140 [16];
  const_reverse_iterator i_5;
  VMState state;
  indent local_c0;
  int local_bc;
  char local_b5;
  indent local_b4;
  __normal_iterator<const_NutFunction::LineInfo_*,_std::vector<NutFunction::LineInfo,_std::allocator<NutFunction::LineInfo>_>_>
  local_b0;
  ulong local_a8;
  size_t i_4;
  const_iterator lineInfo;
  int64_t currentLine;
  spaces local_88;
  indent local_84;
  undefined1 local_80 [16];
  const_reverse_iterator i_3;
  __normal_iterator<const_NutFunction::OuterValueInfo_*,_std::vector<NutFunction::OuterValueInfo,_std::allocator<NutFunction::OuterValueInfo>_>_>
  local_68;
  __normal_iterator<const_NutFunction::OuterValueInfo_*,_std::vector<NutFunction::OuterValueInfo,_std::allocator<NutFunction::OuterValueInfo>_>_>
  local_60;
  const_iterator i_2;
  __normal_iterator<const_SqObject_*,_std::vector<SqObject,_std::allocator<SqObject>_>_> local_50;
  __normal_iterator<const_SqObject_*,_std::vector<SqObject,_std::allocator<SqObject>_>_> local_48;
  const_iterator i_1;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_38;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_30;
  const_iterator i;
  ostream *out_local;
  int n_local;
  NutFunction *this_local;
  
  if ((this->m_IsGenerator & 1U) != 0) {
    indent::indent((indent *)((long)&i._M_current + 4),n);
    poVar5 = operator<<(out,(indent *)((long)&i._M_current + 4));
    poVar5 = std::operator<<(poVar5,"// Function is a generator.");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  if ((g_DebugMode & 1U) != 0) {
    indent::indent((indent *)&i,n);
    poVar5 = operator<<(out,(indent *)&i);
    poVar5 = std::operator<<(poVar5,"// Defaults:");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    local_30._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin(&this->m_DefaultParams);
    while( true ) {
      local_38._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::end(&this->m_DefaultParams);
      bVar2 = __gnu_cxx::operator!=(&local_30,&local_38);
      if (!bVar2) break;
      indent::indent((indent *)((long)&i_1._M_current + 4),n);
      poVar5 = operator<<(out,(indent *)((long)&i_1._M_current + 4));
      poVar5 = std::operator<<(poVar5,"//\t");
      piVar6 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_30);
      this_00 = (void *)std::ostream::operator<<(poVar5,*piVar6);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_30);
    }
    std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
    indent::indent((indent *)&i_1,n);
    poVar5 = operator<<(out,(indent *)&i_1);
    poVar5 = std::operator<<(poVar5,"// Literals:");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    local_48._M_current =
         (SqObject *)std::vector<SqObject,_std::allocator<SqObject>_>::begin(&this->m_Literals);
    while( true ) {
      local_50._M_current =
           (SqObject *)std::vector<SqObject,_std::allocator<SqObject>_>::end(&this->m_Literals);
      bVar2 = __gnu_cxx::operator!=(&local_48,&local_50);
      if (!bVar2) break;
      indent::indent((indent *)((long)&i_2._M_current + 4),n);
      poVar5 = operator<<(out,(indent *)((long)&i_2._M_current + 4));
      poVar5 = std::operator<<(poVar5,"//\t");
      obj = __gnu_cxx::
            __normal_iterator<const_SqObject_*,_std::vector<SqObject,_std::allocator<SqObject>_>_>::
            operator*(&local_48);
      poVar5 = operator<<(poVar5,obj);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      __gnu_cxx::
      __normal_iterator<const_SqObject_*,_std::vector<SqObject,_std::allocator<SqObject>_>_>::
      operator++(&local_48);
    }
    std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
    indent::indent((indent *)&i_2,n);
    poVar5 = operator<<(out,(indent *)&i_2);
    poVar5 = std::operator<<(poVar5,"// Outer values:");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    local_60._M_current =
         (OuterValueInfo *)
         std::vector<NutFunction::OuterValueInfo,_std::allocator<NutFunction::OuterValueInfo>_>::
         begin(&this->m_OuterValues);
    while( true ) {
      local_68._M_current =
           (OuterValueInfo *)
           std::vector<NutFunction::OuterValueInfo,_std::allocator<NutFunction::OuterValueInfo>_>::
           end(&this->m_OuterValues);
      bVar2 = __gnu_cxx::operator!=(&local_60,&local_68);
      if (!bVar2) break;
      indent::indent((indent *)((long)&i_3.current._M_current + 4),n);
      poVar5 = operator<<(out,(indent *)((long)&i_3.current._M_current + 4));
      poVar5 = std::operator<<(poVar5,"//\t");
      pOVar7 = __gnu_cxx::
               __normal_iterator<const_NutFunction::OuterValueInfo_*,_std::vector<NutFunction::OuterValueInfo,_std::allocator<NutFunction::OuterValueInfo>_>_>
               ::operator->(&local_60);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,pOVar7->type);
      poVar5 = std::operator<<(poVar5,"  src=");
      pOVar7 = __gnu_cxx::
               __normal_iterator<const_NutFunction::OuterValueInfo_*,_std::vector<NutFunction::OuterValueInfo,_std::allocator<NutFunction::OuterValueInfo>_>_>
               ::operator->(&local_60);
      poVar5 = operator<<(poVar5,&pOVar7->src);
      poVar5 = std::operator<<(poVar5,"  name=");
      pOVar7 = __gnu_cxx::
               __normal_iterator<const_NutFunction::OuterValueInfo_*,_std::vector<NutFunction::OuterValueInfo,_std::allocator<NutFunction::OuterValueInfo>_>_>
               ::operator->(&local_60);
      poVar5 = operator<<(poVar5,&pOVar7->name);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      __gnu_cxx::
      __normal_iterator<const_NutFunction::OuterValueInfo_*,_std::vector<NutFunction::OuterValueInfo,_std::allocator<NutFunction::OuterValueInfo>_>_>
      ::operator++(&local_60);
    }
    std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
    indent::indent((indent *)&i_3,n);
    poVar5 = operator<<(out,(indent *)&i_3);
    poVar5 = std::operator<<(poVar5,"// Local identifiers:");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::vector<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>::rbegin
              ((vector<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_> *)
               (local_80 + 8));
    while( true ) {
      std::vector<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>::rend
                ((vector<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_> *)
                 local_80);
      bVar2 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<const_NutFunction::LocalVarInfo_*,_std::vector<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>_>_>
                               *)(local_80 + 8),
                              (reverse_iterator<__gnu_cxx::__normal_iterator<const_NutFunction::LocalVarInfo_*,_std::vector<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>_>_>
                               *)local_80);
      if (!bVar2) break;
      indent::indent(&local_84,n);
      poVar5 = operator<<(out,&local_84);
      poVar5 = std::operator<<(poVar5,"//   -");
      pLVar11 = std::
                reverse_iterator<__gnu_cxx::__normal_iterator<const_NutFunction::LocalVarInfo_*,_std::vector<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>_>_>
                ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_NutFunction::LocalVarInfo_*,_std::vector<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>_>_>
                              *)(local_80 + 8));
      poVar5 = std::operator<<(poVar5,(string *)pLVar11);
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<const_NutFunction::LocalVarInfo_*,_std::vector<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>_>_>
      ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_NutFunction::LocalVarInfo_*,_std::vector<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>_>_>
                    *)(local_80 + 8));
      iVar4 = std::__cxx11::string::size();
      spaces::spaces(&local_88,10 - iVar4);
      poVar5 = operator<<(poVar5,&local_88);
      poVar5 = std::operator<<(poVar5," // pos=");
      pLVar11 = std::
                reverse_iterator<__gnu_cxx::__normal_iterator<const_NutFunction::LocalVarInfo_*,_std::vector<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>_>_>
                ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_NutFunction::LocalVarInfo_*,_std::vector<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>_>_>
                              *)(local_80 + 8));
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,pLVar11->pos);
      poVar5 = std::operator<<(poVar5,"  start=");
      pLVar11 = std::
                reverse_iterator<__gnu_cxx::__normal_iterator<const_NutFunction::LocalVarInfo_*,_std::vector<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>_>_>
                ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_NutFunction::LocalVarInfo_*,_std::vector<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>_>_>
                              *)(local_80 + 8));
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,pLVar11->start_op);
      poVar5 = std::operator<<(poVar5,"  end=");
      pLVar11 = std::
                reverse_iterator<__gnu_cxx::__normal_iterator<const_NutFunction::LocalVarInfo_*,_std::vector<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>_>_>
                ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_NutFunction::LocalVarInfo_*,_std::vector<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>_>_>
                              *)(local_80 + 8));
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,pLVar11->end_op);
      pLVar11 = std::
                reverse_iterator<__gnu_cxx::__normal_iterator<const_NutFunction::LocalVarInfo_*,_std::vector<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>_>_>
                ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_NutFunction::LocalVarInfo_*,_std::vector<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>_>_>
                              *)(local_80 + 8));
      pcVar12 = "";
      if ((pLVar11->foreachLoopState & 1U) != 0) {
        pcVar12 = " foreach state";
      }
      poVar5 = std::operator<<(poVar5,pcVar12);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<const_NutFunction::LocalVarInfo_*,_std::vector<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>_>_>
      ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_NutFunction::LocalVarInfo_*,_std::vector<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>_>_>
                    *)(local_80 + 8));
    }
    std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
    indent::indent((indent *)((long)&currentLine + 4),n);
    poVar5 = operator<<(out,(indent *)((long)&currentLine + 4));
    poVar5 = std::operator<<(poVar5,"// Instructions:");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    lineInfo._M_current = (LineInfo *)0x0;
    i_4 = (size_t)std::vector<NutFunction::LineInfo,_std::allocator<NutFunction::LineInfo>_>::begin
                            (&this->m_LineInfos);
    for (local_a8 = 0; uVar1 = local_a8,
        sVar8 = std::vector<NutFunction::Instruction,_std::allocator<NutFunction::Instruction>_>::
                size(&this->m_Instructions), uVar1 < sVar8; local_a8 = local_a8 + 1) {
      while( true ) {
        local_b0._M_current =
             (LineInfo *)
             std::vector<NutFunction::LineInfo,_std::allocator<NutFunction::LineInfo>_>::end
                       (&this->m_LineInfos);
        bVar3 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_NutFunction::LineInfo_*,_std::vector<NutFunction::LineInfo,_std::allocator<NutFunction::LineInfo>_>_>
                            *)&i_4,&local_b0);
        uVar1 = local_a8;
        bVar2 = false;
        if (bVar3) {
          pLVar9 = __gnu_cxx::
                   __normal_iterator<const_NutFunction::LineInfo_*,_std::vector<NutFunction::LineInfo,_std::allocator<NutFunction::LineInfo>_>_>
                   ::operator->((__normal_iterator<const_NutFunction::LineInfo_*,_std::vector<NutFunction::LineInfo,_std::allocator<NutFunction::LineInfo>_>_>
                                 *)&i_4);
          bVar2 = (pLVar9->op & 0xffffffffU) <= uVar1;
        }
        if (!bVar2) break;
        pLVar9 = __gnu_cxx::
                 __normal_iterator<const_NutFunction::LineInfo_*,_std::vector<NutFunction::LineInfo,_std::allocator<NutFunction::LineInfo>_>_>
                 ::operator->((__normal_iterator<const_NutFunction::LineInfo_*,_std::vector<NutFunction::LineInfo,_std::allocator<NutFunction::LineInfo>_>_>
                               *)&i_4);
        lineInfo._M_current = (LineInfo *)pLVar9->line;
        __gnu_cxx::
        __normal_iterator<const_NutFunction::LineInfo_*,_std::vector<NutFunction::LineInfo,_std::allocator<NutFunction::LineInfo>_>_>
        ::operator++((__normal_iterator<const_NutFunction::LineInfo_*,_std::vector<NutFunction::LineInfo,_std::allocator<NutFunction::LineInfo>_>_>
                      *)&i_4);
      }
      indent::indent(&local_b4,n);
      poVar5 = operator<<(out,&local_b4);
      poVar5 = std::operator<<(poVar5,"// ");
      local_b5 = (char)std::setfill<char>(' ');
      poVar5 = std::operator<<(poVar5,local_b5);
      local_bc = (int)std::setw(5);
      poVar5 = std::operator<<(poVar5,(_Setw)local_bc);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(long)lineInfo._M_current);
      std::operator<<(poVar5,"  ");
      iVar4 = (int)local_a8;
      pvVar10 = std::vector<NutFunction::Instruction,_std::allocator<NutFunction::Instruction>_>::
                operator[](&this->m_Instructions,local_a8);
      PrintOpcode(this,out,iVar4,pvVar10);
      std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
    }
    indent::indent(&local_c0,n);
    poVar5 = operator<<(out,&local_c0);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    indent::indent((indent *)((long)&state.m_BlockState.parent + 4),n);
    poVar5 = operator<<(out,(indent *)((long)&state.m_BlockState.parent + 4));
    poVar5 = std::operator<<(poVar5,"// Decompilation attempt:");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  VMState::VMState((VMState *)&i_5,this,this->m_StackSize);
  std::vector<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>::rbegin
            ((vector<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_> *)
             (local_140 + 8));
  while( true ) {
    std::vector<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>::rend
              ((vector<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_> *)
               local_140);
    bVar2 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<const_NutFunction::LocalVarInfo_*,_std::vector<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>_>_>
                             *)(local_140 + 8),
                            (reverse_iterator<__gnu_cxx::__normal_iterator<const_NutFunction::LocalVarInfo_*,_std::vector<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>_>_>
                             *)local_140);
    if (!bVar2) break;
    pLVar11 = std::
              reverse_iterator<__gnu_cxx::__normal_iterator<const_NutFunction::LocalVarInfo_*,_std::vector<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>_>_>
              ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_NutFunction::LocalVarInfo_*,_std::vector<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>_>_>
                            *)(local_140 + 8));
    if ((pLVar11->start_op == 0) &&
       (pLVar11 = std::
                  reverse_iterator<__gnu_cxx::__normal_iterator<const_NutFunction::LocalVarInfo_*,_std::vector<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>_>_>
                  ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_NutFunction::LocalVarInfo_*,_std::vector<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>_>_>
                                *)(local_140 + 8)), (pLVar11->foreachLoopState & 1U) == 0)) {
      this_01 = (LocalVariableExpression *)operator_new(0x28);
      pLVar11 = std::
                reverse_iterator<__gnu_cxx::__normal_iterator<const_NutFunction::LocalVarInfo_*,_std::vector<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>_>_>
                ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_NutFunction::LocalVarInfo_*,_std::vector<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>_>_>
                              *)(local_140 + 8));
      LocalVariableExpression::LocalVariableExpression(this_01,&pLVar11->name);
      std::shared_ptr<Expression>::shared_ptr<LocalVariableExpression,void>(local_160,this_01);
      pLVar11 = std::
                reverse_iterator<__gnu_cxx::__normal_iterator<const_NutFunction::LocalVarInfo_*,_std::vector<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>_>_>
                ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_NutFunction::LocalVarInfo_*,_std::vector<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>_>_>
                              *)(local_140 + 8));
      this_02 = VMState::AtStack((VMState *)&i_5,pLVar11->pos);
      std::shared_ptr<Expression>::operator=(this_02,local_160);
      std::shared_ptr<Expression>::~shared_ptr(local_160);
    }
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_NutFunction::LocalVarInfo_*,_std::vector<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_NutFunction::LocalVarInfo_*,_std::vector<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>_>_>
                  *)(local_140 + 8));
  }
  do {
    while( true ) {
      bVar2 = VMState::EndOfInstructions((VMState *)&i_5);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        VMState::PrintOutput((VMState *)&i_5,out,n);
        VMState::~VMState((VMState *)&i_5);
        return;
      }
      iVar4 = VMState::IP((VMState *)&i_5);
      pvVar10 = std::vector<NutFunction::Instruction,_std::allocator<NutFunction::Instruction>_>::
                operator[](&this->m_Instructions,(long)iVar4);
      if (pvVar10->op == '\x13') break;
LAB_00116249:
      DecompileStatement(this,(VMState *)&i_5);
    }
    iVar4 = VMState::IP((VMState *)&i_5);
    sVar8 = std::vector<NutFunction::Instruction,_std::allocator<NutFunction::Instruction>_>::size
                      (&this->m_Instructions);
    if ((long)iVar4 != sVar8 - 1) goto LAB_00116249;
    iVar4 = VMState::IP((VMState *)&i_5);
    pvVar10 = std::vector<NutFunction::Instruction,_std::allocator<NutFunction::Instruction>_>::
              operator[](&this->m_Instructions,(long)iVar4);
    if (pvVar10->arg0 != -1) goto LAB_00116249;
    VMState::NextInstruction((VMState *)&i_5);
  } while( true );
}

Assistant:

void NutFunction::GenerateBodySource( int n, std::ostream& out ) const
{
	//for( auto i = m_Functions.begin(); i != m_Functions.end(); ++i)
	//	i->GenerateFunctionSource(n, out, extraInfo);

	if (m_IsGenerator)
		out << indent(n) << "// Function is a generator." << std::endl;

	if (g_DebugMode)
	{
		out << indent(n) << "// Defaults:" << std::endl;
		for( std::vector<int>::const_iterator i = m_DefaultParams.begin(); i != m_DefaultParams.end(); ++i)
			out << indent(n) << "//\t" << *i << std::endl;
		
		out << std::endl;

		out << indent(n) << "// Literals:" << std::endl;
		for( std::vector<SqObject>::const_iterator i = m_Literals.begin(); i != m_Literals.end(); ++i)
			out << indent(n) << "//\t" << *i << std::endl;

		out << std::endl;

		out << indent(n) << "// Outer values:" << std::endl;
		for( vector<OuterValueInfo>::const_iterator i = m_OuterValues.begin(); i != m_OuterValues.end(); ++i)
			out << indent(n) << "//\t" << i->type << "  src=" << i->src << "  name=" << i->name << std::endl; 

		out << std::endl;

		out << indent(n) << "// Local identifiers:" << std::endl;
		for(vector<NutFunction::LocalVarInfo>::const_reverse_iterator i = m_Locals.rbegin(); i != m_Locals.rend(); ++i)
		{
			out << indent(n) << "//   -" << i->name << spaces(10 - i->name.size()) 
				<< " // pos=" << i->pos << "  start=" << i->start_op << "  end=" << i->end_op << (i->foreachLoopState ? " foreach state" : "") << std::endl;
		}

		out << std::endl;
		out << indent(n) << "// Instructions:" << std::endl;

		int64_t currentLine = 0;
		vector<LineInfo>::const_iterator lineInfo = m_LineInfos.begin();

		for(size_t i = 0; i < m_Instructions.size(); ++i)
		{
			while (lineInfo != m_LineInfos.end() && i >= (unsigned int)lineInfo->op)
			{
				currentLine = lineInfo->line;
				++lineInfo;
			}

			out << indent(n) << "// " << std::setfill(' ') << std::setw(5) << currentLine << "  ";
			PrintOpcode(out, (int)i, m_Instructions[i]);
			out << std::endl;
		}

		out << indent(n) << std::endl;
		out << indent(n) << "// Decompilation attempt:" << std::endl;
	}

	// Crate new state for decompiler virtual machine
	VMState state(*this, m_StackSize);

	// Set initial stack elements to local identifiers
	for(vector<NutFunction::LocalVarInfo>::const_reverse_iterator i = m_Locals.rbegin(); i != m_Locals.rend(); ++i)	
		if (i->start_op == 0 && !i->foreachLoopState)
			state.AtStack(i->pos) = ExpressionPtr(new LocalVariableExpression(i->name));

	// Decompiler loop
	while(!state.EndOfInstructions())
	{
		if (m_Instructions[state.IP()].op == OP_RETURN && (state.IP() == m_Instructions.size() - 1) && m_Instructions[state.IP()].arg0 == -1)
		{
			// This is last return statement in function - can be skipped
			state.NextInstruction();
			continue;	
		}

		DecompileStatement(state);
	}

	// Print decompiled code
	state.PrintOutput(out, n);
}